

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.c
# Opt level: O0

void * mi_malloc_small(size_t size)

{
  void *pvVar1;
  size_t in_RDI;
  
  mi_prim_get_default_heap();
  pvVar1 = mi_heap_malloc_small((mi_heap_t *)size,in_RDI);
  return pvVar1;
}

Assistant:

void* mi_malloc_small(size_t size) mi_attr_noexcept {
  return mi_heap_malloc_small(mi_prim_get_default_heap(), size);
}